

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfPxr24Compressor.cpp
# Opt level: O2

int __thiscall
Imf_2_5::Pxr24Compressor::uncompress
          (Pxr24Compressor *this,char *inPtr,int inSize,Box2i *range,char **outPtr)

{
  _Rb_tree_color _Var1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  const_iterator cVar5;
  ConstIterator CVar6;
  InputExc *this_00;
  long lVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  byte *pbVar11;
  long lVar12;
  byte *pbVar13;
  int iVar14;
  size_t k;
  int x;
  char *pcVar15;
  uint pixel;
  uLongf tmpSize;
  int local_40;
  int local_3c;
  char **local_38;
  
  if (inSize == 0) {
    *outPtr = this->_outBuffer;
    return 0;
  }
  tmpSize = (long)this->_numScanLines * (long)this->_maxScanLineSize;
  local_38 = outPtr;
  iVar3 = ::uncompress(this->_tmpBuffer,&tmpSize,inPtr,(long)inSize);
  if (iVar3 == 0) {
    local_3c = (range->min).x;
    iVar3 = (range->max).x;
    if (this->_maxX < iVar3) {
      iVar3 = this->_maxX;
    }
    x = (range->min).y;
    local_40 = (range->max).y;
    if (this->_maxY < local_40) {
      local_40 = this->_maxY;
    }
    pbVar10 = this->_tmpBuffer;
    pcVar15 = this->_outBuffer;
    for (; x <= local_40; x = x + 1) {
      cVar5._M_node = (_Base_ptr)ChannelList::begin(this->_channels);
      while (CVar6 = ChannelList::end(this->_channels),
            (const_iterator)cVar5._M_node != CVar6._i._M_node) {
        iVar4 = Imath_2_5::modp(x,*(int *)&cVar5._M_node[9]._M_parent);
        pbVar8 = pbVar10;
        if (iVar4 == 0) {
          iVar4 = numSamples(*(int *)&cVar5._M_node[9].field_0x4,local_3c,iVar3);
          pixel = 0;
          _Var1 = cVar5._M_node[9]._M_color;
          lVar7 = (long)iVar4;
          if (_Var1 == 2) {
            pbVar9 = pbVar10 + lVar7;
            pbVar11 = pbVar9 + lVar7;
            pbVar8 = pbVar11 + lVar7;
            if (tmpSize < (ulong)((long)pbVar8 - (long)this->_tmpBuffer)) {
LAB_001c56eb:
              anon_unknown_10::notEnoughData();
              goto LAB_001c56f0;
            }
            iVar14 = 0;
            if (iVar4 < 1) {
              iVar4 = iVar14;
            }
            for (; iVar14 != iVar4; iVar14 = iVar14 + 1) {
              pixel = pixel + ((uint)*pbVar11 << 8 | (uint)*pbVar9 << 0x10 | (uint)*pbVar10 << 0x18)
              ;
              for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
                pcVar15[lVar7] = *(char *)((long)&pixel + lVar7);
              }
              pbVar10 = pbVar10 + 1;
              pbVar9 = pbVar9 + 1;
              pbVar11 = pbVar11 + 1;
              pcVar15 = pcVar15 + 4;
            }
          }
          else if (_Var1 == _S_black) {
            pbVar8 = pbVar10 + lVar7 * 2;
            if (tmpSize < (ulong)((long)pbVar8 - (long)this->_tmpBuffer)) goto LAB_001c56eb;
            lVar12 = 0;
            if (iVar4 < 1) {
              iVar4 = 0;
            }
            for (; iVar4 != (int)lVar12; lVar12 = lVar12 + 1) {
              pixel = pixel + CONCAT11(pbVar10[lVar12],pbVar10[lVar12 + lVar7]);
              *(short *)pcVar15 = (short)pixel;
              pcVar15 = pcVar15 + 2;
            }
          }
          else if (_Var1 == _S_red) {
            pbVar9 = pbVar10 + lVar7;
            pbVar11 = pbVar9 + lVar7;
            pbVar13 = pbVar11 + lVar7;
            pbVar8 = pbVar13 + lVar7;
            if (tmpSize < (ulong)((long)pbVar8 - (long)this->_tmpBuffer)) goto LAB_001c56eb;
            iVar14 = 0;
            if (iVar4 < 1) {
              iVar4 = iVar14;
            }
            for (; iVar14 != iVar4; iVar14 = iVar14 + 1) {
              pixel = pixel + ((uint)*pbVar13 |
                              (uint)*pbVar11 << 8 | (uint)*pbVar9 << 0x10 | (uint)*pbVar10 << 0x18);
              for (lVar7 = 0; lVar7 != 4; lVar7 = lVar7 + 1) {
                pcVar15[lVar7] = *(char *)((long)&pixel + lVar7);
              }
              pbVar10 = pbVar10 + 1;
              pbVar9 = pbVar9 + 1;
              pbVar11 = pbVar11 + 1;
              pbVar13 = pbVar13 + 1;
              pcVar15 = pcVar15 + 4;
            }
          }
        }
        cVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(cVar5._M_node);
        pbVar10 = pbVar8;
      }
    }
    if (tmpSize <= (ulong)((long)pbVar10 - (long)this->_tmpBuffer)) {
      pcVar2 = this->_outBuffer;
      *local_38 = pcVar2;
      return (int)pcVar15 - (int)pcVar2;
    }
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    pcVar15 = "Error decompressing data (input data are longer than expected).";
  }
  else {
LAB_001c56f0:
    this_00 = (InputExc *)__cxa_allocate_exception(0x48);
    pcVar15 = "Data decompression (zlib) failed.";
  }
  Iex_2_5::InputExc::InputExc(this_00,pcVar15);
  __cxa_throw(this_00,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
}

Assistant:

int		
Pxr24Compressor::uncompress (const char *inPtr,
			     int inSize,
			     Box2i range,
			     const char *&outPtr)
{
    if (inSize == 0)
    {
	outPtr = _outBuffer;
	return 0;
    }

    uLongf tmpSize = _maxScanLineSize * _numScanLines;

    if (Z_OK != ::uncompress ((Bytef *)_tmpBuffer,
			      &tmpSize,
			      (const Bytef *) inPtr,
			      inSize))
    {
	throw IEX_NAMESPACE::InputExc ("Data decompression (zlib) failed.");
    }

    int minX = range.min.x;
    int maxX = min (range.max.x, _maxX);
    int minY = range.min.y;
    int maxY = min (range.max.y, _maxY);

    const unsigned char *tmpBufferEnd = _tmpBuffer;
    char *writePtr = _outBuffer;

    for (int y = minY; y <= maxY; ++y)
    {
	for (ChannelList::ConstIterator i = _channels.begin();
	     i != _channels.end();
	     ++i)
	{
	    const Channel &c = i.channel();

	    if (modp (y, c.ySampling) != 0)
		continue;

	    int n = numSamples (c.xSampling, minX, maxX);

	    const unsigned char *ptr[4];
	    unsigned int pixel = 0;

	    switch (c.type)
	    {
	      case OPENEXR_IMF_INTERNAL_NAMESPACE::UINT:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		ptr[2] = ptr[1] + n;
		ptr[3] = ptr[2] + n;
		tmpBufferEnd = ptr[3] + n;

		if ( (uLongf)(tmpBufferEnd - _tmpBuffer) > tmpSize)
		    notEnoughData();

		for (int j = 0; j < n; ++j)
		{
		    unsigned int diff = (*(ptr[0]++) << 24) |
					(*(ptr[1]++) << 16) |
					(*(ptr[2]++) <<  8) |
					 *(ptr[3]++);

		    pixel += diff;

		    char *pPtr = (char *) &pixel;

		    for (size_t k = 0; k < sizeof (pixel); ++k)
			*writePtr++ = *pPtr++;
		}

		break;

	      case OPENEXR_IMF_INTERNAL_NAMESPACE::HALF:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		tmpBufferEnd = ptr[1] + n;

        if ( (uLongf)(tmpBufferEnd - _tmpBuffer) > tmpSize)
		    notEnoughData();

		for (int j = 0; j < n; ++j)
		{
		    unsigned int diff = (*(ptr[0]++) << 8) |
					 *(ptr[1]++);

		    pixel += diff;

		    half * hPtr = (half *) writePtr;
		    hPtr->setBits ((unsigned short) pixel);
		    writePtr += sizeof (half);
		}

		break;

	      case OPENEXR_IMF_INTERNAL_NAMESPACE::FLOAT:

		ptr[0] = tmpBufferEnd;
		ptr[1] = ptr[0] + n;
		ptr[2] = ptr[1] + n;
		tmpBufferEnd = ptr[2] + n;

        if ( (uLongf) (tmpBufferEnd - _tmpBuffer) > tmpSize)
		    notEnoughData();

		for (int j = 0; j < n; ++j)
		{
		    unsigned int diff = (*(ptr[0]++) << 24) |
					(*(ptr[1]++) << 16) |
					(*(ptr[2]++) <<  8);
		    pixel += diff;

		    char *pPtr = (char *) &pixel;

		    for (size_t k = 0; k < sizeof (pixel); ++k)
			*writePtr++ = *pPtr++;
		}

		break;

	      default:

		assert (false);
	    }
	}
    }

    if ((uLongf) (tmpBufferEnd - _tmpBuffer) < tmpSize)
	tooMuchData();

    outPtr = _outBuffer;
    return writePtr - _outBuffer;
}